

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

void __thiscall
lest::failure::failure(failure *this,location *where_,text *expr_,text *decomposition_)

{
  allocator local_132;
  allocator local_131;
  string local_130 [32];
  text local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  text local_b0;
  text local_90;
  location local_70;
  string local_48 [32];
  
  std::__cxx11::string::string(local_48,"failed",&local_131);
  std::__cxx11::string::string((string *)&local_90,local_48);
  location::location(&local_70,where_);
  std::operator+(&local_f0,expr_," for ");
  std::operator+(&local_d0,&local_f0,decomposition_);
  std::__cxx11::string::string((string *)&local_b0,(string *)&local_d0);
  std::__cxx11::string::string(local_130,"",&local_132);
  std::__cxx11::string::string((string *)&local_110,local_130);
  message::message(&this->super_message,&local_90,&local_70,&local_b0,&local_110);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  *(undefined ***)&this->super_message = &PTR__message_00187b90;
  return;
}

Assistant:

failure( location where_, text expr_, text decomposition_)
    : message( "failed", where_, expr_ + " for " + decomposition_) {}